

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::StaticOccluderFragDepthCullCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,StaticOccluderFragDepthCullCase *this)

{
  float depth;
  string local_30;
  
  Performance::(anonymous_namespace)::Utils::getStaticFragDepthFragmentShader_abi_cxx11_();
  Utils::quadWith(__return_storage_ptr__,&local_30,depth);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry					(void) const { return Utils::quadWith(Utils::getStaticFragDepthFragmentShader(), 0.2f); }